

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file_handle.cpp
# Opt level: O0

void __thiscall
SplitFixture_Small_Test<const_unsigned_char>::TestBody
          (SplitFixture_Small_Test<const_unsigned_char> *this)

{
  bool bVar1;
  MockSpec<unsigned_long_(const_void_*,_unsigned_long)> *this_00;
  TypedExpectation<unsigned_long_(const_void_*,_unsigned_long)> *pTVar2;
  char *message;
  AssertHelper local_f8;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  size_t total;
  Action<unsigned_long_(const_void_*,_unsigned_long)> local_c0;
  WithoutMatchers local_9d [13];
  Matcher<unsigned_long> local_90;
  Matcher<const_void_*> local_78;
  MockSpec<unsigned_long_(const_void_*,_unsigned_long)> local_60;
  uchar local_28 [8];
  TypeParam buffer [10];
  size_t size;
  SplitFixture_Small_Test<const_unsigned_char> *this_local;
  
  stack0xffffffffffffffe8 = 10;
  buffer[0] = '\0';
  buffer[1] = '\0';
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  testing::Matcher<const_void_*>::Matcher(&local_78,local_28);
  testing::Matcher<unsigned_long>::Matcher(&local_90,10);
  anon_unknown.dwarf_60765::SplitFixture<const_unsigned_char>::mock_callback::gmock_call
            (&local_60,&(this->super_SplitFixture<const_unsigned_char>).callback,&local_78,&local_90
            );
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<unsigned_long_(const_void_*,_unsigned_long)>::operator()
                      (&local_60,local_9d,(void *)0x0);
  pTVar2 = testing::internal::MockSpec<unsigned_long_(const_void_*,_unsigned_long)>::
           InternalExpectedAt(this_00,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file_handle.cpp"
                              ,0x40,"this->callback","call (buffer, size)");
  pTVar2 = testing::internal::TypedExpectation<unsigned_long_(const_void_*,_unsigned_long)>::Times
                     (pTVar2,1);
  testing::Return<unsigned_long>((testing *)&total,10);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_c0,(ReturnAction *)&total);
  testing::internal::TypedExpectation<unsigned_long_(const_void_*,_unsigned_long)>::WillOnce
            (pTVar2,&local_c0);
  testing::Action<unsigned_long_(const_void_*,_unsigned_long)>::~Action(&local_c0);
  testing::internal::ReturnAction<unsigned_long>::~ReturnAction
            ((ReturnAction<unsigned_long> *)&total);
  testing::internal::MockSpec<unsigned_long_(const_void_*,_unsigned_long)>::~MockSpec(&local_60);
  testing::Matcher<unsigned_long>::~Matcher(&local_90);
  testing::Matcher<const_void_*>::~Matcher(&local_78);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::file::details::
         split<unsigned_short,unsigned_char_const,(anonymous_namespace)::SplitFixture<unsigned_char_const>::mock_callback>
                   (local_28,10,&(this->super_SplitFixture<const_unsigned_char>).callback);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_e8,"size","total",(unsigned_long *)(buffer + 8),
             (unsigned_long *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file_handle.cpp"
               ,0x44,message);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  return;
}

Assistant:

TYPED_TEST (SplitFixture, Small) {
    constexpr std::size_t size{10};
    TypeParam buffer[size] = {};

    using ::testing::Return;
    EXPECT_CALL (this->callback, call (buffer, size)).Times (1).WillOnce (Return (size));

    using pstore::file::details::split;
    std::size_t const total = split<std::uint16_t> (buffer, sizeof (buffer), this->callback);
    EXPECT_EQ (size, total);
}